

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O3

void duckdb::TestVectorFlat::Generate(TestVectorInfo *info)

{
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var1;
  const_reference pvVar2;
  DataChunk *this;
  pointer pDVar3;
  Allocator *allocator;
  reference this_00;
  const_reference val;
  vector<duckdb::LogicalType,_true> *pvVar4;
  ulong uVar5;
  pointer pLVar6;
  ulong uVar7;
  size_type __n;
  idx_t index;
  TestGeneratedValues result_values;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_68;
  TestGeneratedValues local_60;
  long local_48;
  ulong local_40;
  idx_t local_38;
  
  GenerateValues(&local_60,info);
  local_48 = 0;
  uVar7 = 0;
  while( true ) {
    if (local_60.column_values.
        super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        .
        super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_60.column_values.
        super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        .
        super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar5 = 0;
    }
    else {
      pvVar2 = vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[]
                         (&local_60.column_values,0);
      uVar5 = (long)(pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start >> 6;
    }
    if (uVar5 <= uVar7) break;
    this = (DataChunk *)operator_new(0x40);
    DataChunk::DataChunk(this);
    local_68._M_head_impl = this;
    pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&local_68);
    allocator = Allocator::DefaultAllocator();
    DataChunk::Initialize(pDVar3,allocator,info->types,0x800);
    if (local_60.column_values.
        super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        .
        super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_60.column_values.
        super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        .
        super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_40 = 0;
    }
    else {
      pvVar2 = vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[]
                         (&local_60.column_values,0);
      local_40 = (long)(pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start >> 6;
    }
    local_38 = local_40 - uVar7;
    if (0x7ff < local_38) {
      local_38 = 0x800;
    }
    pvVar4 = info->types;
    pLVar6 = (pvVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish != pLVar6) {
      uVar5 = local_40 + local_48;
      if (0x7ff < uVar5) {
        uVar5 = 0x800;
      }
      __n = 0;
      do {
        if (local_40 != uVar7) {
          index = 0;
          do {
            pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                     operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                                 *)&local_68);
            this_00 = vector<duckdb::Vector,_true>::operator[](&pDVar3->data,__n);
            pvVar2 = vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[]
                               (&local_60.column_values,__n);
            val = vector<duckdb::Value,_true>::operator[](pvVar2,uVar7 + index);
            Vector::SetValue(this_00,index,val);
            index = index + 1;
          } while (uVar5 + (uVar5 == 0) != index);
          pvVar4 = info->types;
          pLVar6 = (pvVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                   .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        __n = __n + 1;
      } while (__n < (ulong)(((long)(pvVar4->
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ).
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar6 >> 3)
                            * -0x5555555555555555));
    }
    pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&local_68);
    pDVar3->count = local_38;
    ::std::
    vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)info->entries,
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               &local_68);
    _Var1._M_head_impl = local_68._M_head_impl;
    if (local_68._M_head_impl != (DataChunk *)0x0) {
      DataChunk::~DataChunk(local_68._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
    uVar7 = uVar7 + 0x800;
    local_48 = local_48 + -0x800;
  }
  ::std::
  vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ::~vector((vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
             *)&local_60);
  return;
}

Assistant:

static void Generate(TestVectorInfo &info) {
		auto result_values = GenerateValues(info);
		for (idx_t cur_row = 0; cur_row < result_values.Rows(); cur_row += STANDARD_VECTOR_SIZE) {
			auto result = make_uniq<DataChunk>();
			result->Initialize(Allocator::DefaultAllocator(), info.types);
			auto cardinality = MinValue<idx_t>(STANDARD_VECTOR_SIZE, result_values.Rows() - cur_row);
			for (idx_t c = 0; c < info.types.size(); c++) {
				for (idx_t i = 0; i < cardinality; i++) {
					result->data[c].SetValue(i, result_values.GetValue(cur_row + i, c));
				}
			}
			result->SetCardinality(cardinality);
			info.entries.push_back(std::move(result));
		}
	}